

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t *
roaring_bitmap_lazy_or(roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  ushort key;
  byte bVar1;
  byte bVar2;
  roaring_array_t *ra;
  container_t *pcVar3;
  roaring_bitmap_t *prVar4;
  ushort *puVar5;
  bitset_container_t *c;
  uint uVar6;
  undefined7 in_register_00000011;
  uint uVar7;
  uint16_t key_00;
  roaring_array_t *prVar8;
  roaring_array_t *sa;
  long *c_00;
  int iVar9;
  ulong uVar10;
  uint8_t result_type;
  byte local_7a;
  uint8_t type2;
  roaring_array_t *local_78;
  uint local_6c;
  ulong local_68;
  ulong local_60;
  roaring_array_t *local_58;
  undefined4 local_4c;
  ulong local_48;
  undefined8 local_40;
  bitset_container_t *local_38;
  
  result_type = '\0';
  uVar7 = (x1->high_low_container).size;
  local_60 = (ulong)uVar7;
  prVar4 = x2;
  if (uVar7 != 0) {
    uVar6 = (x2->high_low_container).size;
    prVar4 = x1;
    if (uVar6 != 0) {
      local_4c = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
      ra = &roaring_bitmap_create_with_capacity(uVar6 + uVar7)->high_low_container;
      bVar1 = 1;
      if (((x1->high_low_container).flags & 1) == 0) {
        bVar1 = (x2->high_low_container).flags & 1;
      }
      ra->flags = ra->flags & 0xfe | bVar1;
      puVar5 = (x1->high_low_container).keys;
      key_00 = *(x2->high_low_container).keys;
      local_48 = (ulong)(uVar6 - 1);
      local_6c = 0;
      uVar10 = 0;
      local_68 = (ulong)uVar6;
      local_58 = &x1->high_low_container;
LAB_00116cab:
      do {
        key = *puVar5;
        uVar10 = (ulong)(int)uVar10;
        while( true ) {
          sa = local_58;
          uVar7 = local_6c;
          iVar9 = (int)uVar10;
          if (key == key_00) break;
          if (key < key_00) {
            local_7a = local_58->typecodes[local_6c & 0xffff];
            local_78 = ra;
            pcVar3 = get_copy_of_container
                               (local_58->containers[local_6c & 0xffff],&local_7a,
                                (_Bool)(local_58->flags & 1));
            if ((sa->flags & 1) != 0) {
              sa->containers[(int)uVar7] = pcVar3;
              sa->typecodes[(int)uVar7] = local_7a;
            }
            ra_append(local_78,key,pcVar3,local_7a);
            uVar7 = uVar7 + 1;
            ra = local_78;
            if (uVar7 == (uint)local_60) goto LAB_00117063;
            puVar5 = (ushort *)((ulong)((uVar7 & 0xffff) * 2) + (long)sa->keys);
            local_6c = uVar7;
            goto LAB_00116cab;
          }
          type2 = (x2->high_low_container).typecodes[uVar10 & 0xffff];
          pcVar3 = get_copy_of_container
                             ((x2->high_low_container).containers[uVar10 & 0xffff],&type2,
                              (_Bool)((x2->high_low_container).flags & 1));
          if (((x2->high_low_container).flags & 1) != 0) {
            (x2->high_low_container).containers[uVar10] = pcVar3;
            (x2->high_low_container).typecodes[uVar10] = type2;
          }
          ra_append(ra,key_00,pcVar3,type2);
          if ((int)local_48 == iVar9) {
            uVar7 = (uint)local_60;
            sa = local_58;
            uVar10 = local_68;
            uVar6 = local_6c;
            goto LAB_0011705f;
          }
          uVar10 = uVar10 + 1;
          key_00 = (x2->high_low_container).keys[uVar10 & 0xffff];
        }
        local_7a = local_58->typecodes[(ushort)local_6c];
        c_00 = (long *)local_58->containers[(ushort)local_6c];
        bVar1 = (x2->high_low_container).typecodes[uVar10 & 0xffff];
        prVar8 = (roaring_array_t *)(x2->high_low_container).containers[uVar10 & 0xffff];
        type2 = bVar1;
        if ((char)local_4c == '\0') {
LAB_00116d9b:
          bVar2 = local_7a;
          if (local_7a == 4) {
            bVar2 = *(byte *)(c_00 + 1);
            c_00 = (long *)*c_00;
          }
          if (bVar1 == 4) {
            bVar1 = *(byte *)&prVar8->containers;
            prVar8 = *(roaring_array_t **)prVar8;
          }
          local_40 = 0;
          prVar4 = (roaring_bitmap_t *)
                   (*(code *)(&DAT_00122240 +
                             *(int *)(&DAT_00122240 +
                                     (ulong)(((uint)bVar1 + (uint)bVar2 * 4) - 5) * 4)))
                             (c_00,prVar8);
          return prVar4;
        }
        bVar2 = local_7a;
        if (local_7a == 4) {
          bVar2 = *(byte *)(c_00 + 1);
        }
        if (bVar2 == 1) goto LAB_00116d9b;
        bVar2 = bVar1;
        if (bVar1 == 4) {
          bVar2 = *(byte *)&prVar8->containers;
        }
        if (bVar2 == 1) goto LAB_00116d9b;
        bVar2 = local_7a;
        if (local_7a == 4) {
          bVar2 = *(byte *)(c_00 + 1);
          c_00 = (long *)*c_00;
        }
        local_78 = prVar8;
        local_38 = container_to_bitset(c_00,bVar2);
        local_7a = 1;
        c = (bitset_container_t *)container_lazy_ior(local_38,'\x01',local_78,bVar1,&result_type);
        if (c != local_38) {
          container_free(local_38,'\x01');
        }
        ra_append(ra,key,c,result_type);
        uVar6 = local_6c + 1;
        uVar7 = (uint)local_60;
        if ((uVar6 == uVar7) || ((int)local_48 == iVar9)) {
          uVar10 = (ulong)(iVar9 + 1);
LAB_0011705f:
          if (uVar6 == uVar7) {
LAB_00117063:
            bVar1 = (x2->high_low_container).flags;
            uVar6 = (uint)uVar10;
            uVar7 = (uint)local_68;
            sa = &x2->high_low_container;
          }
          else {
            if ((int)uVar10 != (int)local_68) {
              return (roaring_bitmap_t *)ra;
            }
            bVar1 = sa->flags;
          }
          ra_append_copy_range(ra,sa,uVar6,uVar7,(_Bool)(bVar1 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar10 = uVar10 + 1;
        puVar5 = (ushort *)((ulong)((uVar6 & 0xffff) * 2) + (long)sa->keys);
        key_00 = (x2->high_low_container).keys[(uint)uVar10 & 0xffff];
        local_6c = uVar6;
      } while( true );
    }
  }
  prVar4 = roaring_bitmap_copy(prVar4);
  return prVar4;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_or(const roaring_bitmap_t *x1,
                                         const roaring_bitmap_t *x2,
                                         const bool bitsetconversion) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c;
            if (bitsetconversion &&
                (get_container_type(c1, type1) != BITSET_CONTAINER_TYPE) &&
                (get_container_type(c2, type2) != BITSET_CONTAINER_TYPE)) {
                container_t *newc1 =
                    container_mutable_unwrap_shared(c1, &type1);
                newc1 = container_to_bitset(newc1, type1);
                type1 = BITSET_CONTAINER_TYPE;
                c = container_lazy_ior(newc1, type1, c2, type2, &result_type);
                if (c != newc1) {  // should not happen
                    container_free(newc1, type1);
                }
            } else {
                c = container_lazy_or(c1, type1, c2, type2, &result_type);
            }
            // since we assume that the initial containers are non-empty,
            // the
            // result here
            // can only be non-empty
            ra_append(&answer->high_low_container, s1, c, result_type);
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}